

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMember::IfcStructuralSurfaceMember
          (IfcStructuralSurfaceMember *this)

{
  *(undefined ***)&this->field_0x160 = &PTR__Object_009120b0;
  *(undefined8 *)&this->field_0x168 = 0;
  *(char **)&this->field_0x170 = "IfcStructuralSurfaceMember";
  IfcStructuralMember::IfcStructuralMember
            (&this->super_IfcStructuralMember,&PTR_construction_vtable_24__0096ec10);
  *(undefined8 *)&(this->super_IfcStructuralMember).field_0x128 = 0;
  *(undefined8 *)
   &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.super_IfcObject =
       0x96eae0;
  *(undefined8 *)&this->field_0x160 = 0x96ebf8;
  *(undefined8 *)
   &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
    field_0x88 = 0x96eb08;
  (this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x96eb30;
  *(undefined8 *)
   &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x96eb58;
  *(undefined8 *)
   &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.field_0x100 =
       0x96eb80;
  *(undefined8 *)
   &(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.field_0x110 =
       0x96eba8;
  *(undefined8 *)&(this->super_IfcStructuralMember).super_IfcStructuralItem.field_0x120 = 0x96ebd0;
  *(undefined1 **)&(this->super_IfcStructuralMember).field_0x130 = &this->field_0x140;
  *(undefined8 *)&this->field_0x138 = 0;
  this->field_0x140 = 0;
  (this->Thickness).have = false;
  return;
}

Assistant:

IfcStructuralSurfaceMember() : Object("IfcStructuralSurfaceMember") {}